

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_DrawParticle_C(vissprite_t *vis)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  DWORD DVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  short sVar12;
  uint uVar13;
  uint uVar14;
  DrawerCommandQueue *this;
  byte *pbVar15;
  short sVar16;
  int iVar17;
  int iVar18;
  int x;
  int iVar19;
  
  bVar1 = (vis->Style).colormap[(vis->field_14).field_0.startfrac];
  iVar4 = (vis->field_3).field_1.y1;
  iVar5 = (vis->field_3).field_1.y2;
  sVar2 = vis->x1;
  iVar19 = (int)sVar2;
  sVar3 = vis->x2;
  this = (DrawerCommandQueue *)vis;
  if (FirstInterestingDrawseg < DAT_0072ca04) {
    uVar9 = FirstInterestingDrawseg;
    lVar11 = drawsegs;
    lVar10 = InterestingDrawsegs;
    uVar13 = DAT_0072ca04;
    do {
      uVar13 = uVar13 - 1;
      this = (DrawerCommandQueue *)(*(long *)(lVar10 + (ulong)uVar13 * 8) * 0x98);
      if (*(int *)((long)this->memorypool + lVar11 + 0x70) == 0) {
        this = (DrawerCommandQueue *)((long)this->memorypool + lVar11);
        sVar12 = *(short *)((long)this->memorypool + 0x18);
        if ((((sVar12 < sVar3) &&
             (sVar16 = *(short *)((long)this->memorypool + 0x1a), sVar2 < sVar16)) &&
            (iVar17 = (int)*(short *)((long)this->memorypool + 0x1c),
            ((float)((sVar3 + iVar19) / 2 - iVar17) *
            (*(float *)((long)this->memorypool + 0x2c) - *(float *)((long)this->memorypool + 0x28)))
            / (float)(*(short *)((long)this->memorypool + 0x1e) - iVar17) +
            *(float *)((long)this->memorypool + 0x28) < vis->idepth)) &&
           (*(int *)((long)this->memorypool + 0x90) == vis->CurrentPortalUniq)) {
          if (sVar12 <= sVar2) {
            sVar12 = sVar2;
          }
          if (sVar3 <= sVar16) {
            sVar16 = sVar3;
          }
          R_RenderMaskedSegRange((drawseg_t *)this,(int)sVar12,(int)sVar16);
          uVar9 = FirstInterestingDrawseg;
          lVar11 = drawsegs;
          lVar10 = InterestingDrawsegs;
        }
      }
    } while (uVar9 < uVar13);
  }
  DrawerCommandQueue::WaitForWorkers(this);
  if (sVar2 < sVar3) {
    uVar13 = vis->renderflags * 0x100 + 0x100;
    DVar6 = Col2RGB8[(int)uVar13 >> 10][bVar1];
    iVar17 = RenderTarget->Pitch;
    do {
      drawerargs::dc_x = iVar19;
      if ((CurrentPortalInSkybox == '\0') && ((ulong)DAT_017ac64c != 0)) {
        lVar11 = 0;
        do {
          plVar7 = *(long **)(portaldrawsegs + lVar11);
          if ((((int)plVar7[0x12] == CurrentPortalUniq) &&
              (puVar8 = *(undefined8 **)(*plVar7 + 0x18),
              1.52587890625e-05 <
              (double)puVar8[3] * (*(double *)*puVar8 - (double)(vis->gpos).X) +
              (double)puVar8[2] * ((double)(vis->gpos).Y - ((double *)*puVar8)[1]))) &&
             (((short)plVar7[3] <= iVar19 && (iVar19 < *(short *)((long)plVar7 + 0x1a)))))
          goto LAB_002f1c50;
          lVar11 = lVar11 + 8;
        } while ((ulong)DAT_017ac64c << 3 != lVar11);
      }
      if (iVar4 <= iVar5) {
        pbVar15 = (byte *)((long)iVar19 + (long)(int)(&ylookup)[iVar4] + drawerargs::dc_destorg);
        iVar18 = (iVar5 - iVar4) + 1;
        do {
          uVar14 = Col2RGB8[(int)(0x10000 - (uVar13 & 0xfffffc00)) >> 10][*pbVar15] + DVar6 |
                   0x1f07c1f;
          *pbVar15 = RGB32k.All[uVar14 >> 0xf & uVar14];
          pbVar15 = pbVar15 + iVar17;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
LAB_002f1c50:
      iVar19 = iVar19 + 1;
    } while (iVar19 != sVar3);
  }
  return;
}

Assistant:

void R_DrawParticle_C (vissprite_t *vis)
{
	DWORD *bg2rgb;
	int spacing;
	BYTE *dest;
	DWORD fg;
	BYTE color = vis->Style.colormap[vis->startfrac];
	int yl = vis->y1;
	int ycount = vis->y2 - yl + 1;
	int x1 = vis->x1;
	int countbase = vis->x2 - x1;

	R_DrawMaskedSegsBehindParticle (vis);

	DrawerCommandQueue::WaitForWorkers();

	// vis->renderflags holds translucency level (0-255)
	{
		fixed_t fglevel, bglevel;
		DWORD *fg2rgb;

		fglevel = ((vis->renderflags + 1) << 8) & ~0x3ff;
		bglevel = FRACUNIT-fglevel;
		fg2rgb = Col2RGB8[fglevel>>10];
		bg2rgb = Col2RGB8[bglevel>>10];
		fg = fg2rgb[color];
	}

	/*

	spacing = RenderTarget->GetPitch() - countbase;
	dest = ylookup[yl] + x1 + dc_destorg;

	do
	{
		int count = countbase;
		do
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[bg & (bg>>15)];
		} while (--count);
		dest += spacing;
	} while (--ycount);*/

	// original was row-wise
	// width = countbase
	// height = ycount

	spacing = RenderTarget->GetPitch();

	for (int x = x1; x < (x1+countbase); x++)
	{
		dc_x = x;
		if (R_ClipSpriteColumnWithPortals(vis))
			continue;
		dest = ylookup[yl] + x + dc_destorg;
		for (int y = 0; y < ycount; y++)
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[bg & (bg>>15)];
			dest += spacing;
		}
	}
}